

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::Data
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,
          Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *other)

{
  long lVar1;
  int iVar2;
  undefined3 uVar3;
  bool bVar4;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar5;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar6;
  long in_RSI;
  Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar7;
  Node<int,_QEvdevTouchScreenData::Contact> *newNode;
  Node<int,_QEvdevTouchScreenData::Contact> *n;
  size_t index;
  Span *span;
  size_t s;
  R r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)(in_RDI->offsets + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)(in_RDI->offsets + 0x10) = *(undefined8 *)(in_RSI + 0x10);
  *(undefined8 *)(in_RDI->offsets + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  in_RDI->offsets[0x20] = '\0';
  in_RDI->offsets[0x21] = '\0';
  in_RDI->offsets[0x22] = '\0';
  in_RDI->offsets[0x23] = '\0';
  in_RDI->offsets[0x24] = '\0';
  in_RDI->offsets[0x25] = '\0';
  in_RDI->offsets[0x26] = '\0';
  in_RDI->offsets[0x27] = '\0';
  RVar7 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar7.spans;
  *(Span **)(in_RDI->offsets + 0x20) = local_28;
  local_20 = RVar7.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar4 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::hasNode
                        ((Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)
                         (lVar1 + local_48 * 0x90),local_58);
      if (bVar4) {
        pNVar5 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::at
                           (this_00,(size_t)in_RDI);
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        pNVar6 = Bucket::insert((Bucket *)0x1588cb);
        iVar2 = (pNVar5->value).trackingId;
        pNVar6->key = pNVar5->key;
        (pNVar6->value).trackingId = iVar2;
        iVar2 = (pNVar5->value).y;
        (pNVar6->value).x = (pNVar5->value).x;
        (pNVar6->value).y = iVar2;
        iVar2 = (pNVar5->value).pressure;
        (pNVar6->value).maj = (pNVar5->value).maj;
        (pNVar6->value).pressure = iVar2;
        uVar3 = *(undefined3 *)&(pNVar5->value).field_0x15;
        (pNVar6->value).state = (pNVar5->value).state;
        *(undefined3 *)&(pNVar6->value).field_0x15 = uVar3;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }